

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_parse_renegotiation_info(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  byte local_2;
  
  if (ssl->renego_status == 0) {
    if ((len == 1) && (*buf == '\0')) {
      ssl->secure_renegotiation = 1;
      return 0;
    }
  }
  else {
    sVar2 = ssl->verify_data_len;
    if ((sVar2 * 2 + 1 == len) && (sVar2 * 2 == (ulong)*buf)) {
      local_2 = 0;
      if (sVar2 != 0) {
        sVar3 = 0;
        local_2 = 0;
        do {
          local_2 = local_2 | buf[sVar3 + 1] ^ ssl->own_verify_data[sVar3];
          sVar3 = sVar3 + 1;
        } while (sVar2 != sVar3);
      }
      if (local_2 == 0) {
        bVar1 = 0;
        if (sVar2 != 0) {
          sVar3 = 0;
          do {
            bVar1 = bVar1 | buf[sVar3 + sVar2 + 1] ^ ssl->peer_verify_data[sVar3];
            sVar3 = sVar3 + 1;
          } while (sVar3 != sVar2);
        }
        if (bVar1 == 0) {
          return 0;
        }
      }
    }
  }
  mbedtls_ssl_send_alert_message(ssl,'\x02','(');
  return -0x7980;
}

Assistant:

static int ssl_parse_renegotiation_info( mbedtls_ssl_context *ssl,
                                         const unsigned char *buf,
                                         size_t len )
{
#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if( ssl->renego_status != MBEDTLS_SSL_INITIAL_HANDSHAKE )
    {
        /* Check verify-data in constant-time. The length OTOH is no secret */
        if( len    != 1 + ssl->verify_data_len ||
            buf[0] !=     ssl->verify_data_len ||
            mbedtls_ssl_safer_memcmp( buf + 1, ssl->peer_verify_data,
                          ssl->verify_data_len ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-matching renegotiation info" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
        }
    }
    else
#endif /* MBEDTLS_SSL_RENEGOTIATION */
    {
        if( len != 1 || buf[0] != 0x0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-zero length renegotiation info" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
        }

        ssl->secure_renegotiation = MBEDTLS_SSL_SECURE_RENEGOTIATION;
    }

    return( 0 );
}